

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::DepthBoundsParamTestInstance>
               *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  StencilOpState _front;
  StencilOpState _front_00;
  StencilOpState _back;
  StencilOpState _back_00;
  undefined4 uVar1;
  DepthStencilBaseCase *this_01;
  mapped_type *ppcVar2;
  VkPhysicalDeviceFeatures *pVVar3;
  NotSupportedError *this_02;
  long lVar4;
  DepthStencilState *pDVar5;
  DepthStencilState *pDVar6;
  byte bVar7;
  StencilOpState local_138;
  VkStencilOpState local_118;
  StencilOpState local_f8;
  DepthStencilState local_d8;
  VkStencilOpState local_70;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_50;
  
  bVar7 = 0;
  this_01 = (DepthStencilBaseCase *)operator_new(0x2d0);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_50,&(this->m_shaderPaths)._M_t);
  local_d8.super_VkPipelineDepthStencilStateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)&local_d8);
  vertexShaderName = *ppcVar2;
  local_138.super_VkStencilOpState.failOp = VK_STENCIL_OP_ZERO;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_50,(key_type *)&local_138);
  DynamicState::anon_unknown_0::DepthStencilBaseCase::DepthStencilBaseCase
            (this_01,context,vertexShaderName,*ppcVar2);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DepthStencilBaseCase_00bd5d30;
  pVVar3 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
  if (pVVar3->depthBounds != 0) {
    local_138.super_VkStencilOpState.failOp = 0xbf800000;
    local_138.super_VkStencilOpState.passOp = 0x3f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3ec00000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    this_00 = &this_01->m_data;
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = VK_STENCIL_OP_KEEP;
    local_138.super_VkStencilOpState.passOp = 0x3f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3ec00000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = 0xbf800000;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3ec00000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = VK_STENCIL_OP_KEEP;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3ec00000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = VK_STENCIL_OP_KEEP;
    local_138.super_VkStencilOpState.passOp = 0x3f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f200000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState._0_8_ = &DAT_3f8000003f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f200000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = VK_STENCIL_OP_KEEP;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f200000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = 0x3f800000;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f200000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = 0xbf800000;
    local_138.super_VkStencilOpState.passOp = 0x3f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f800000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState._0_8_ = &DAT_3f8000003f800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f800000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = 0xbf800000;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f800000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    local_138.super_VkStencilOpState.failOp = 0x3f800000;
    local_138.super_VkStencilOpState.passOp = 0xbf800000;
    local_138.super_VkStencilOpState.depthFailOp = 0x3f800000;
    local_138.super_VkStencilOpState.compareOp = 0x3f800000;
    local_f8.super_VkStencilOpState.failOp = 0xffff0000;
    tcu::RGBA::toVec((RGBA *)&local_f8);
    PositionColorVertex::PositionColorVertex
              ((PositionColorVertex *)&local_d8,(Vec4 *)&local_138,(Vec4 *)&local_118);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,(PositionColorVertex *)&local_d8)
    ;
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              (&local_138,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_118,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front.super_VkStencilOpState.depthFailOp = local_138.super_VkStencilOpState.depthFailOp;
    _front.super_VkStencilOpState.failOp = local_138.super_VkStencilOpState.failOp;
    _front.super_VkStencilOpState.passOp = local_138.super_VkStencilOpState.passOp;
    _front.super_VkStencilOpState.compareOp = local_138.super_VkStencilOpState.compareOp;
    _front.super_VkStencilOpState.compareMask = local_138.super_VkStencilOpState.compareMask;
    _front.super_VkStencilOpState.writeMask = local_138.super_VkStencilOpState.writeMask;
    _front.super_VkStencilOpState.reference = local_138.super_VkStencilOpState.reference;
    _back.super_VkStencilOpState.depthFailOp = local_118.depthFailOp;
    _back.super_VkStencilOpState.failOp = local_118.failOp;
    _back.super_VkStencilOpState.passOp = local_118.passOp;
    _back.super_VkStencilOpState.compareOp = local_118.compareOp;
    _back.super_VkStencilOpState.compareMask = local_118.compareMask;
    _back.super_VkStencilOpState.writeMask = local_118.writeMask;
    _back.super_VkStencilOpState.reference = local_118.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              (&local_d8,1,1,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
    pDVar5 = &local_d8;
    pDVar6 = &this_01->m_depthStencilState_1;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined4 *)&(pDVar5->super_VkPipelineDepthStencilStateCreateInfo).field_0x4;
      (pDVar6->super_VkPipelineDepthStencilStateCreateInfo).sType =
           (pDVar5->super_VkPipelineDepthStencilStateCreateInfo).sType;
      *(undefined4 *)&(pDVar6->super_VkPipelineDepthStencilStateCreateInfo).field_0x4 = uVar1;
      pDVar5 = (DepthStencilState *)((long)pDVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pDVar6 = (DepthStencilState *)((long)pDVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              (&local_f8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
              ((StencilOpState *)&local_70,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
               VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
    _front_00.super_VkStencilOpState.passOp = local_f8.super_VkStencilOpState.passOp;
    _front_00.super_VkStencilOpState.failOp = local_f8.super_VkStencilOpState.failOp;
    _front_00.super_VkStencilOpState.depthFailOp = local_f8.super_VkStencilOpState.depthFailOp;
    _front_00.super_VkStencilOpState.compareOp = local_f8.super_VkStencilOpState.compareOp;
    _front_00.super_VkStencilOpState.compareMask = local_f8.super_VkStencilOpState.compareMask;
    _front_00.super_VkStencilOpState.writeMask = local_f8.super_VkStencilOpState.writeMask;
    _front_00.super_VkStencilOpState.reference = local_f8.super_VkStencilOpState.reference;
    _back_00.super_VkStencilOpState.depthFailOp = local_70.depthFailOp;
    _back_00.super_VkStencilOpState.failOp = local_70.failOp;
    _back_00.super_VkStencilOpState.passOp = local_70.passOp;
    _back_00.super_VkStencilOpState.compareOp = local_70.compareOp;
    _back_00.super_VkStencilOpState.compareMask = local_70.compareMask;
    _back_00.super_VkStencilOpState.writeMask = local_70.writeMask;
    _back_00.super_VkStencilOpState.reference = local_70.reference;
    Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
              (&local_d8,0,0,VK_COMPARE_OP_NEVER,1,0,_front_00,_back_00,0.0,1.0);
    pDVar5 = &local_d8;
    pDVar6 = &this_01->m_depthStencilState_2;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined4 *)&(pDVar5->super_VkPipelineDepthStencilStateCreateInfo).field_0x4;
      (pDVar6->super_VkPipelineDepthStencilStateCreateInfo).sType =
           (pDVar5->super_VkPipelineDepthStencilStateCreateInfo).sType;
      *(undefined4 *)&(pDVar6->super_VkPipelineDepthStencilStateCreateInfo).field_0x4 = uVar1;
      pDVar5 = (DepthStencilState *)((long)pDVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      pDVar6 = (DepthStencilState *)((long)pDVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    DynamicState::anon_unknown_0::DepthStencilBaseCase::initialize(this_01);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_50);
    return &this_01->super_TestInstance;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Depth bounds test is unsupported",(allocator<char> *)&local_138);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)&local_d8);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}